

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

uint32_t __thiscall
CompressedArray::calculate_key_size(CompressedArray *this,Key key,Key prev_key,bool same_word)

{
  uint32_t uVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CompressedArray *in_RDI;
  uint32_t size;
  uint32_t local_20;
  int local_10;
  int iStack_c;
  int local_8;
  uint32_t uStack_4;
  
  local_20 = 0;
  local_10 = (int)in_RDX;
  local_8 = (int)in_RSI;
  if ((in_CL & 1) == 0) {
    local_20 = calculate_number_size(in_RDI,local_8 - local_10,in_RDI->word_index_diff_log_radix);
  }
  uStack_4 = (uint32_t)((ulong)in_RSI >> 0x20);
  if (local_8 == local_10) {
    iStack_c = (int)((ulong)in_RDX >> 0x20);
    uVar1 = calculate_number_size(in_RDI,uStack_4 - iStack_c,in_RDI->context_index_diff_log_radix);
  }
  else {
    uVar1 = calculate_number_size(in_RDI,uStack_4,in_RDI->context_index_log_radix);
  }
  local_20 = uVar1 + local_20;
  return local_20;
}

Assistant:

uint32_t CompressedArray::calculate_key_size(Key key, Key prev_key, bool same_word) const {
    uint32_t size = 0;
    if (!same_word)
        size += calculate_number_size(key.word_index - prev_key.word_index,
                                      word_index_diff_log_radix);
    if (key.word_index == prev_key.word_index)
        size += calculate_number_size(key.context_index - prev_key.context_index,
                                      context_index_diff_log_radix);
    else
        size += calculate_number_size(key.context_index, context_index_log_radix);
    return size;
}